

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * flatbuffers::ConCatPathFileName
                   (string *__return_storage_ptr__,string *path,string *filename)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  char *pcVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + path->_M_string_length);
  sVar3 = __return_storage_ptr__->_M_string_length;
  if (sVar3 != 0) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    cVar1 = pcVar2[sVar3 - 1];
    if (cVar1 != '/') {
      if (cVar1 == '\\') {
        pcVar2[sVar3 - 1] = '/';
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
    }
  }
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(filename->_M_dataplus)._M_p);
  pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
  if ((*pcVar4 == '.') && (pcVar4[1] == '/')) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConCatPathFileName(const std::string &path,
                               const std::string &filename) {
  std::string filepath = path;
  if (filepath.length()) {
    char &filepath_last_character = filepath.back();
    if (filepath_last_character == kPathSeparatorWindows) {
      filepath_last_character = kPathSeparator;
    } else if (filepath_last_character != kPathSeparator) {
      filepath += kPathSeparator;
    }
  }
  filepath += filename;
  // Ignore './' at the start of filepath.
  if (filepath[0] == '.' && filepath[1] == kPathSeparator) {
    filepath.erase(0, 2);
  }
  return filepath;
}